

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

uint32_t __thiscall libtorrent::aux::torrent::tracker_key(torrent *this)

{
  uint uVar1;
  hasher *phVar2;
  long lVar3;
  uintptr_t ses;
  uintptr_t self;
  uint32_t storage;
  sha1_hash h;
  hasher local_40;
  session_interface *local_38;
  torrent *local_30;
  uint local_28;
  sha1_hash local_24;
  
  local_38 = (this->super_torrent_hot_members).m_ses;
  local_28 = 0;
  if ((this->m_storage).m_disk_io != (disk_interface *)0x0) {
    local_28 = (this->m_storage).m_idx.m_val;
  }
  local_30 = this;
  lcrypto::hasher::hasher(&local_40,(char *)&local_30,8);
  phVar2 = lcrypto::hasher::update(&local_40,(char *)&local_28,4);
  phVar2 = lcrypto::hasher::update(phVar2,(char *)&local_38,8);
  lcrypto::hasher::final(&local_24,phVar2);
  lcrypto::hasher::~hasher(&local_40);
  lVar3 = 0;
  uVar1 = 0;
  do {
    uVar1 = (uint)*(byte *)((long)local_24.m_number._M_elems + lVar3) | uVar1 << 8;
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  return uVar1;
}

Assistant:

std::uint32_t torrent::tracker_key() const
	{
		auto const self = reinterpret_cast<uintptr_t>(this);
		auto const ses = reinterpret_cast<uintptr_t>(&m_ses);
		std::uint32_t const storage = m_storage
			? static_cast<std::uint32_t>(static_cast<storage_index_t>(m_storage))
			: 0;
		sha1_hash const h = hasher(reinterpret_cast<char const*>(&self), sizeof(self))
			.update(reinterpret_cast<char const*>(&storage), sizeof(storage))
			.update(reinterpret_cast<char const*>(&ses), sizeof(ses))
			.final();
		unsigned char const* ptr = &h[0];
		return aux::read_uint32(ptr);
	}